

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ComputeFileMD5(string *source,char *md5out)

{
  cmCryptoHashMD5 md5;
  string str;
  cmCryptoHashMD5 cStack_48;
  string local_38;
  
  cmCryptoHashMD5::cmCryptoHashMD5(&cStack_48);
  cmCryptoHash::HashFile(&local_38,&cStack_48.super_cmCryptoHash,source);
  strncpy(md5out,local_38._M_dataplus._M_p,0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cmCryptoHashMD5::~cmCryptoHashMD5(&cStack_48);
  return local_38._M_string_length != 0;
}

Assistant:

bool cmSystemTools::ComputeFileMD5(const std::string& source, char* md5out)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHashMD5 md5;
  std::string str = md5.HashFile(source);
  strncpy(md5out, str.c_str(), 32);
  return !str.empty();
#else
  (void)source;
  (void)md5out;
  cmSystemTools::Message("md5sum not supported in bootstrapping mode","Error");
  return false;
#endif
}